

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

void __thiscall Entity::setAndLoadMesh(Entity *this,string *filePath)

{
  Mesh *pMVar1;
  string local_40;
  
  pMVar1 = this->mesh;
  if (pMVar1 != (Mesh *)0x0) {
    Mesh::~Mesh(pMVar1);
    operator_delete(pMVar1);
  }
  pMVar1 = (Mesh *)operator_new(0x10);
  Mesh::Mesh(pMVar1);
  this->mesh = pMVar1;
  std::__cxx11::string::string((string *)&local_40,(string *)filePath);
  Mesh::loadObj(pMVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Entity::setAndLoadMesh(std::string filePath)
{
	if (mesh != NULL)
	{
		delete mesh;
	}

	mesh = new Mesh();
	mesh->loadObj(filePath);
}